

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O2

bool __thiscall hwtest::pgraph::MthdD3D56Blend::is_valid_val(MthdD3D56Blend *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x54) {
    if ((uVar1 & 0xf) - 9 < 0xfffffff8) {
      return false;
    }
  }
  else if ((uVar1 & 0xf) != 0) {
    return false;
  }
  uVar2 = uVar1 >> 4 & 3;
  if ((((uVar2 != 0) && (uVar2 != 3)) && ((uVar1 & 0xeeee00) == 0 && (uVar1 & 0xc0) != 0)) &&
     (0xfffffffffffffff4 < (ulong)(uVar1 >> 0x18 & 0xf) - 0xc)) {
    return uVar1 + 0xf0000000 < 0xb0000000;
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		if (cls == 0x54) {
			if (extr(val, 0, 4) < 1 || extr(val, 0, 4) > 8)
				return false;
		} else {
			if (extr(val, 0, 4))
				return false;
		}
		if (extr(val, 4, 2) < 1 || extr(val, 4, 2) > 2)
			return false;
		if (!extr(val, 6, 2))
			return false;
		if (extr(val, 9, 3))
			return false;
		if (extr(val, 13, 3))
			return false;
		if (extr(val, 17, 3))
			return false;
		if (extr(val, 21, 3))
			return false;
		if (extr(val, 24, 4) < 1 || extr(val, 24, 4) > 0xb)
			return false;
		if (extr(val, 28, 4) < 1 || extr(val, 28, 4) > 0xb)
			return false;
		return true;
	}